

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlOutputBufferWriteEscape
              (xmlOutputBufferPtr out,xmlChar *str,xmlCharEncodingOutputFunc escaping)

{
  xmlOutputWriteCallback p_Var1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  xmlBufPtr pxVar8;
  xmlChar *pxVar9;
  xmlBufPtr *ppxVar10;
  int iVar11;
  int chunk;
  int cons;
  int local_60;
  int local_5c;
  xmlBufPtr *local_58;
  xmlBufPtr *local_50;
  xmlCharEncodingOutputFunc local_48;
  size_t local_40;
  long local_38;
  
  if ((((out != (xmlOutputBufferPtr)0x0) && (str != (xmlChar *)0x0)) && (out->error == 0)) &&
     ((out->buffer != (xmlBufPtr)0x0 && (iVar3 = xmlBufGetAllocationScheme(out->buffer), iVar3 != 2)
      ))) {
    sVar6 = strlen((char *)str);
    if ((int)sVar6 < 0) {
      return 0;
    }
    if (out->error == 0) {
      local_58 = &out->buffer;
      local_48 = xmlEscapeContent;
      if (escaping != (xmlCharEncodingOutputFunc)0x0) {
        local_48 = escaping;
      }
      local_50 = &out->conv;
      iVar3 = 0;
      do {
        ppxVar10 = local_58;
        iVar11 = (int)sVar6;
        local_5c = iVar11;
        sVar7 = xmlBufAvail(*local_58);
        local_60 = (int)sVar7;
        if (local_60 < 0x28) {
          iVar4 = xmlBufGrow(*ppxVar10,100);
          iVar11 = -1;
          if (iVar4 < 0) {
            return -1;
          }
        }
        else {
          if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
            pxVar9 = xmlBufEnd(*ppxVar10);
            iVar4 = (*local_48)(pxVar9,&local_60,str,&local_5c);
            if (iVar4 < 0) {
              return -1;
            }
            if (local_60 == 0) {
              return -1;
            }
            xmlBufAddLen(out->buffer,(long)local_60);
            iVar4 = local_60;
            if (out->writecallback != (xmlOutputWriteCallback)0x0) {
              pxVar8 = *ppxVar10;
LAB_0019a4a5:
              sVar7 = xmlBufUse(pxVar8);
              iVar4 = (int)sVar7;
            }
          }
          else {
            if (out->conv == (xmlBufPtr)0x0) {
              pxVar8 = xmlBufCreate();
              out->conv = pxVar8;
            }
            pxVar9 = xmlBufEnd(*ppxVar10);
            iVar4 = (*local_48)(pxVar9,&local_60,str,&local_5c);
            if (iVar4 < 0) {
              return -1;
            }
            if (local_60 == 0) {
              return -1;
            }
            xmlBufAddLen(*ppxVar10,(long)local_60);
            sVar7 = xmlBufUse(*ppxVar10);
            if ((sVar7 < 4000) && (local_5c == iVar11)) {
              return iVar3;
            }
            iVar4 = xmlCharEncOutput(out,0);
            if (iVar4 != -3 && iVar4 < 0) {
              iVar3 = 0x608;
              __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
              uVar5 = 0xffffffff;
              goto LAB_0019a61e;
            }
            if (out->writecallback != (xmlOutputWriteCallback)0x0) {
              pxVar8 = out->conv;
              goto LAB_0019a4a5;
            }
            if (iVar4 < 1) {
              iVar4 = 0;
            }
          }
          local_38 = (long)local_5c;
          sVar6 = (size_t)(uint)(iVar11 - local_5c);
          p_Var1 = out->writecallback;
          if (p_Var1 == (xmlOutputWriteCallback)0x0) {
            sVar7 = xmlBufAvail(*local_58);
            if (sVar7 < 4000) {
              xmlBufGrow(*local_58,4000);
            }
          }
          else {
            if (iVar4 < 4000 && iVar11 - local_5c < 1) {
              return iVar3;
            }
            pvVar2 = out->context;
            local_40 = sVar6;
            if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
              pxVar9 = xmlBufContent(*local_58);
              uVar5 = (*p_Var1)(pvVar2,(char *)pxVar9,iVar4);
              ppxVar10 = local_58;
            }
            else {
              pxVar9 = xmlBufContent(*local_50);
              uVar5 = (*p_Var1)(pvVar2,(char *)pxVar9,iVar4);
              ppxVar10 = local_50;
            }
            if (-1 < (int)uVar5) {
              xmlBufShrink(*ppxVar10,(ulong)uVar5);
            }
            if ((int)uVar5 < 0) {
              iVar3 = 0x60a;
              __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)0x0);
LAB_0019a61e:
              out->error = iVar3;
              return uVar5;
            }
            sVar6 = local_40;
            if ((int)(uVar5 ^ 0x7fffffff) < out->written) {
              out->written = 0x7fffffff;
            }
            else {
              out->written = out->written + uVar5;
            }
          }
          str = str + local_38;
          iVar11 = iVar3;
          iVar3 = iVar4 + iVar3;
        }
        if ((int)sVar6 < 1) {
          return iVar3;
        }
        if (iVar11 == iVar3) {
          return iVar3;
        }
      } while( true );
    }
  }
  return -1;
}

Assistant:

int
xmlOutputBufferWriteEscape(xmlOutputBufferPtr out, const xmlChar *str,
                           xmlCharEncodingOutputFunc escaping) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int oldwritten=0;/* loop guard */
    int chunk;       /* number of byte currently processed from str */
    int len;         /* number of bytes in str */
    int cons;        /* byte from str consumed */

    if ((out == NULL) || (out->error) || (str == NULL) ||
        (out->buffer == NULL) ||
	(xmlBufGetAllocationScheme(out->buffer) == XML_BUFFER_ALLOC_IMMUTABLE))
        return(-1);
    len = strlen((const char *)str);
    if (len < 0) return(0);
    if (out->error) return(-1);
    if (escaping == NULL) escaping = xmlEscapeContent;

    do {
        oldwritten = written;

        /*
	 * how many bytes to consume and how many bytes to store.
	 */
	cons = len;
	chunk = xmlBufAvail(out->buffer);

        /*
	 * make sure we have enough room to save first, if this is
	 * not the case force a flush, but make sure we stay in the loop
	 */
	if (chunk < 40) {
	    if (xmlBufGrow(out->buffer, 100) < 0)
	        return(-1);
            oldwritten = -1;
	    continue;
	}

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = escaping(xmlBufEnd(out->buffer) ,
	                   &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (cons == len))
		goto done;

	    /*
	     * convert as much as possible to the output buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = escaping(xmlBufEnd(out->buffer), &chunk, str, &cons);
	    if ((ret < 0) || (chunk == 0)) /* chunk==0 => nothing done */
	        return(-1);
            xmlBufAddLen(out->buffer, chunk);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	str += cons;
	len -= cons;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	} else if (xmlBufAvail(out->buffer) < MINLEN) {
	    xmlBufGrow(out->buffer, MINLEN);
	}
	written += nbchars;
    } while ((len > 0) && (oldwritten != written));

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}